

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderDimmedBackgroundBehindWindow(ImGuiWindow *window,ImU32 col)

{
  ImDrawList *pIVar1;
  ImDrawCmd *__src;
  ImGuiWindow *pIVar2;
  ImVec2 cr_max;
  ImRect local_c8;
  ImRect local_b8;
  ImVec2 local_a8;
  ImDrawList *local_a0;
  ImDrawList *local_98;
  ImDrawList *draw_list_1;
  ImDrawCmd cmd;
  ImVec2 local_48;
  ImVec2 local_40;
  ImDrawList *local_38;
  ImDrawList *draw_list;
  ImRect viewport_rect;
  ImGuiViewportP *viewport;
  ImU32 col_local;
  ImGuiWindow *window_local;
  
  if ((col & 0xff000000) != 0) {
    viewport_rect.Max = (ImVec2)window->Viewport;
    _draw_list = ImGuiViewportP::GetMainRect((ImGuiViewportP *)viewport_rect.Max);
    local_38 = window->RootWindowDockTree->DrawList;
    if ((local_38->CmdBuffer).Size == 0) {
      ImDrawList::AddDrawCmd(local_38);
    }
    pIVar1 = local_38;
    ImVec2::ImVec2(&local_48,1.0,1.0);
    local_40 = ::operator-((ImVec2 *)&draw_list,&local_48);
    ImVec2::ImVec2((ImVec2 *)&cmd.UserCallbackData,1.0,1.0);
    cr_max = ::operator+(&viewport_rect.Min,(ImVec2 *)&cmd.UserCallbackData);
    ImDrawList::PushClipRect(pIVar1,local_40,cr_max,false);
    ImDrawList::AddRectFilled(local_38,(ImVec2 *)&draw_list,&viewport_rect.Min,col,0.0,0);
    __src = ImVector<ImDrawCmd>::back(&local_38->CmdBuffer);
    memcpy(&draw_list_1,__src,0x38);
    if (cmd.VtxOffset != 6) {
      __assert_fail("cmd.ElemCount == 6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                    ,0x1350,"void ImGui::RenderDimmedBackgroundBehindWindow(ImGuiWindow *, ImU32)");
    }
    ImVector<ImDrawCmd>::pop_back(&local_38->CmdBuffer);
    ImVector<ImDrawCmd>::push_front(&local_38->CmdBuffer,(ImDrawCmd *)&draw_list_1);
    ImDrawList::PopClipRect(local_38);
    ImDrawList::AddDrawCmd(local_38);
    if ((window->RootWindow->field_0x3f9 & 1) != 0) {
      pIVar2 = FindFrontMostVisibleChildWindow(window->RootWindowDockTree);
      local_98 = pIVar2->DrawList;
      if ((local_98->CmdBuffer).Size == 0) {
        ImDrawList::AddDrawCmd(local_98);
      }
      local_a0 = draw_list;
      local_a8 = viewport_rect.Min;
      ImDrawList::PushClipRect(local_98,(ImVec2)draw_list,viewport_rect.Min,false);
      pIVar1 = local_98;
      local_b8 = ImGuiWindow::Rect(window->RootWindowDockTree);
      local_c8 = ImGuiWindow::Rect(window->RootWindow);
      RenderRectFilledWithHole(pIVar1,&local_b8,&local_c8,col,0.0);
      ImDrawList::PopClipRect(local_98);
    }
  }
  return;
}

Assistant:

static void ImGui::RenderDimmedBackgroundBehindWindow(ImGuiWindow* window, ImU32 col)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    ImGuiViewportP* viewport = window->Viewport;
    ImRect viewport_rect = viewport->GetMainRect();

    // Draw behind window by moving the draw command at the FRONT of the draw list
    {
        // We've already called AddWindowToDrawData() which called DrawList->ChannelsMerge() on DockNodeHost windows,
        // and draw list have been trimmed already, hence the explicit recreation of a draw command if missing.
        // FIXME: This is creating complication, might be simpler if we could inject a drawlist in drawdata at a given position and not attempt to manipulate ImDrawCmd order.
        ImDrawList* draw_list = window->RootWindowDockTree->DrawList;
        if (draw_list->CmdBuffer.Size == 0)
            draw_list->AddDrawCmd();
        draw_list->PushClipRect(viewport_rect.Min - ImVec2(1, 1), viewport_rect.Max + ImVec2(1, 1), false); // Ensure ImDrawCmd are not merged
        draw_list->AddRectFilled(viewport_rect.Min, viewport_rect.Max, col);
        ImDrawCmd cmd = draw_list->CmdBuffer.back();
        IM_ASSERT(cmd.ElemCount == 6);
        draw_list->CmdBuffer.pop_back();
        draw_list->CmdBuffer.push_front(cmd);
        draw_list->PopClipRect();
        draw_list->AddDrawCmd(); // We need to create a command as CmdBuffer.back().IdxOffset won't be correct if we append to same command.
    }

    // Draw over sibling docking nodes in a same docking tree
    if (window->RootWindow->DockIsActive)
    {
        ImDrawList* draw_list = FindFrontMostVisibleChildWindow(window->RootWindowDockTree)->DrawList;
        if (draw_list->CmdBuffer.Size == 0)
            draw_list->AddDrawCmd();
        draw_list->PushClipRect(viewport_rect.Min, viewport_rect.Max, false);
        RenderRectFilledWithHole(draw_list, window->RootWindowDockTree->Rect(), window->RootWindow->Rect(), col, 0.0f);// window->RootWindowDockTree->WindowRounding);
        draw_list->PopClipRect();
    }
}